

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

int Dau_Dsd6DecomposeSingleVarOne(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars,int v)

{
  int iVar1;
  char cVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  word wVar7;
  
  uVar6 = *pTruth;
  uVar4 = s_Truths6Neg[v] & uVar6;
  bVar3 = (byte)v;
  if ((uVar6 & 1) == 0) {
    if (uVar4 != 0) {
LAB_00501548:
      uVar4 = s_Truths6[v] & uVar6;
      if ((long)uVar6 < 0) {
        if (uVar4 == s_Truths6[v]) {
          cVar2 = '!';
          lVar5 = 1;
          do {
            iVar1 = p->nPos;
            p->nPos = iVar1 + 1;
            p->pOutput[iVar1] = cVar2;
            cVar2 = "!(!"[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          if (5 < (uint)v) goto LAB_005016d4;
          uVar6 = s_Truths6Neg[(uint)v] & *pTruth;
          uVar4 = uVar6 << ((byte)(1 << (bVar3 & 0x1f)) & 0x3f);
          goto LAB_00501615;
        }
      }
      else if (uVar4 == 0) {
        cVar2 = '(';
        lVar5 = 0;
        do {
          iVar1 = p->nPos;
          p->nPos = iVar1 + 1;
          p->pOutput[iVar1] = cVar2;
          cVar2 = "!(!"[lVar5 + 2];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 2);
        if (5 < (uint)v) goto LAB_005016d4;
        uVar6 = s_Truths6Neg[(uint)v] & *pTruth;
        uVar4 = uVar6 << ((byte)(1 << (bVar3 & 0x1f)) & 0x3f);
        goto LAB_005015b6;
      }
      bVar3 = (byte)(1 << (bVar3 & 0x1f));
      if ((s_Truths6Neg[v] & ~(uVar6 >> (bVar3 & 0x3f) ^ uVar6)) != 0) {
        return 0;
      }
      iVar1 = p->nPos;
      p->nPos = iVar1 + 1;
      p->pOutput[iVar1] = '[';
      if (5 < (uint)v) {
LAB_005016d4:
        __assert_fail("iVar >= 0 && iVar < 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x337,"word Abc_Tt6Cofactor0(word, int)");
      }
      *pTruth = (s_Truths6Neg[(uint)v] & *pTruth) << (bVar3 & 0x3f) |
                s_Truths6Neg[(uint)v] & *pTruth;
      p->uConstMask = p->uConstMask | 1 << ((byte)p->nConsts & 0x1f);
      goto LAB_0050161e;
    }
    iVar1 = p->nPos;
    p->nPos = iVar1 + 1;
    p->pOutput[iVar1] = '(';
    if (5 < (uint)v) {
LAB_005016b5:
      __assert_fail("iVar >= 0 && iVar < 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x33c,"word Abc_Tt6Cofactor1(word, int)");
    }
    uVar6 = s_Truths6[(uint)v] & *pTruth;
    uVar4 = uVar6 >> ((byte)(1 << (bVar3 & 0x1f)) & 0x3f);
LAB_005015b6:
    wVar7 = uVar4 | uVar6;
  }
  else {
    if (uVar4 != s_Truths6Neg[v]) goto LAB_00501548;
    cVar2 = '!';
    lVar5 = 0;
    do {
      iVar1 = p->nPos;
      p->nPos = iVar1 + 1;
      p->pOutput[iVar1] = cVar2;
      cVar2 = "!("[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 2);
    if (5 < (uint)v) goto LAB_005016b5;
    uVar6 = s_Truths6[(uint)v] & *pTruth;
    uVar4 = uVar6 >> ((byte)(1 << (bVar3 & 0x1f)) & 0x3f);
LAB_00501615:
    wVar7 = ~(uVar4 | uVar6);
  }
  *pTruth = wVar7;
LAB_0050161e:
  p->nConsts = p->nConsts + 1;
  Dau_DsdWriteVar(p,pVars[v],0);
  pVars[v] = pVars[(long)nVars + -1];
  Abc_TtSwapVars(pTruth,nVars,v,nVars + -1);
  return 1;
}

Assistant:

static inline int Dau_Dsd6DecomposeSingleVarOne( Dau_Dsd_t * p, word * pTruth, int * pVars, int nVars, int v )
{
    // consider negative cofactors
    if ( pTruth[0] & 1 )
    {        
        if ( Abc_Tt6Cof0IsConst1( pTruth[0], v ) ) // !(ax)
        {
            Dau_DsdWriteString( p, "!(" );
            pTruth[0] = ~Abc_Tt6Cofactor1( pTruth[0], v );
            goto finish;            
        }
    }
    else
    {
        if ( Abc_Tt6Cof0IsConst0( pTruth[0], v ) ) // ax
        {
            Dau_DsdWriteString( p, "(" );
            pTruth[0] = Abc_Tt6Cofactor1( pTruth[0], v );
            goto finish;            
        }
    }
    // consider positive cofactors
    if ( pTruth[0] >> 63 )
    {        
        if ( Abc_Tt6Cof1IsConst1( pTruth[0], v ) ) // !(!ax)
        {
            Dau_DsdWriteString( p, "!(!" );
            pTruth[0] = ~Abc_Tt6Cofactor0( pTruth[0], v );
            goto finish;            
        }
    }
    else
    {
        if ( Abc_Tt6Cof1IsConst0( pTruth[0], v ) ) // !ax
        {
            Dau_DsdWriteString( p, "(!" );
            pTruth[0] = Abc_Tt6Cofactor0( pTruth[0], v );
            goto finish;            
        }
    }
    // consider equal cofactors
    if ( Abc_Tt6CofsOpposite( pTruth[0], v ) ) // [ax]
    {
        Dau_DsdWriteString( p, "[" );
        pTruth[0] = Abc_Tt6Cofactor0( pTruth[0], v );
        p->uConstMask |= (1 << p->nConsts);
        goto finish;            
    }
    return 0;

finish:
    p->nConsts++;
    Dau_DsdWriteVar( p, pVars[v], 0 );
    pVars[v] = pVars[nVars-1];
    Abc_TtSwapVars( pTruth, nVars, v, nVars-1 );
    return 1;
}